

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O0

string * __thiscall LTAircraft::GetFlightPhaseRwyString_abi_cxx11_(LTAircraft *this)

{
  ulong uVar1;
  long in_RSI;
  string *in_RDI;
  LTAircraft *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30 [48];
  
  if (0x3b < *(byte *)(in_RSI + 0x448)) {
    __lhs = in_RDI;
    LTFlightData::GetRwyId_abi_cxx11_(*(LTFlightData **)(in_RSI + 0x348));
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      __rhs = &local_50;
      GetFlightPhaseString_abi_cxx11_(in_stack_ffffffffffffff78);
      std::operator+(__lhs,(char)((ulong)__rhs >> 0x38));
      LTFlightData::GetRwyId_abi_cxx11_(*(LTFlightData **)(in_RSI + 0x348));
      std::operator+(__lhs,__rhs);
      std::__cxx11::string::~string(local_30);
      std::__cxx11::string::~string((string *)&local_50);
      return in_RDI;
    }
  }
  GetFlightPhaseString_abi_cxx11_(in_stack_ffffffffffffff78);
  return in_RDI;
}

Assistant:

std::string LTAircraft::GetFlightPhaseRwyString() const
{
    if (phase < FPH_APPROACH || fd.GetRwyId().empty())
        return GetFlightPhaseString();
    else
        return GetFlightPhaseString() + ' ' + fd.GetRwyId();
}